

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O1

void __thiscall FIX::double_conversion::Bignum::SubtractBignum(Bignum *this,Bignum *other)

{
  int iVar1;
  uint *puVar2;
  uint *puVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  
  bVar4 = IsClamped(this);
  if (!bVar4) {
    __assert_fail("IsClamped()",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum.cc"
                  ,0xd4,"void FIX::double_conversion::Bignum::SubtractBignum(const Bignum &)");
  }
  bVar4 = IsClamped(other);
  if (!bVar4) {
    __assert_fail("other.IsClamped()",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum.cc"
                  ,0xd5,"void FIX::double_conversion::Bignum::SubtractBignum(const Bignum &)");
  }
  iVar5 = Compare(other,this);
  if (0 < iVar5) {
    __assert_fail("LessEqual(other, *this)",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum.cc"
                  ,0xd7,"void FIX::double_conversion::Bignum::SubtractBignum(const Bignum &)");
  }
  Align(this,other);
  iVar5 = other->exponent_;
  iVar1 = this->exponent_;
  iVar8 = 0;
  if (other->used_digits_ < 1) {
    bVar4 = true;
    lVar7 = 0;
  }
  else {
    uVar6 = iVar5 - iVar1;
    puVar2 = (other->bigits_).start_;
    puVar3 = (this->bigits_).start_;
    lVar7 = 0;
    do {
      iVar9 = uVar6 + (int)lVar7;
      if (((iVar9 < 0) || ((this->bigits_).length_ <= iVar9)) || ((other->bigits_).length_ <= lVar7)
         ) goto LAB_0016c342;
      uVar10 = (iVar8 + puVar3[(ulong)uVar6 + lVar7]) - puVar2[lVar7];
      puVar3[(ulong)uVar6 + lVar7] = uVar10 & 0xfffffff;
      iVar8 = (int)uVar10 >> 0x1f;
      lVar7 = lVar7 + 1;
    } while (lVar7 < other->used_digits_);
    bVar4 = -1 < (int)uVar10;
  }
  if (!bVar4) {
    puVar2 = (this->bigits_).start_;
    uVar6 = (iVar5 + (int)lVar7) - iVar1;
    do {
      if (((int)uVar6 < 0) || ((this->bigits_).length_ <= (int)uVar6)) {
LAB_0016c342:
        __assert_fail("0 <= index && index < length_",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/utils.h"
                      ,0xcc,
                      "T &FIX::double_conversion::Vector<unsigned int>::operator[](int) const [T = unsigned int]"
                     );
      }
      uVar10 = puVar2[uVar6] - 1;
      puVar2[uVar6] = uVar10 & 0xfffffff;
      uVar6 = uVar6 + 1;
    } while ((int)uVar10 < 0);
  }
  Clamp(this);
  return;
}

Assistant:

void Bignum::SubtractBignum(const Bignum& other) {
  ASSERT(IsClamped());
  ASSERT(other.IsClamped());
  // We require this to be bigger than other.
  ASSERT(LessEqual(other, *this));

  Align(other);

  int offset = other.exponent_ - exponent_;
  Chunk borrow = 0;
  int i;
  for (i = 0; i < other.used_digits_; ++i) {
    ASSERT((borrow == 0) || (borrow == 1));
    Chunk difference = bigits_[i + offset] - other.bigits_[i] - borrow;
    bigits_[i + offset] = difference & kBigitMask;
    borrow = difference >> (kChunkSize - 1);
  }
  while (borrow != 0) {
    Chunk difference = bigits_[i + offset] - borrow;
    bigits_[i + offset] = difference & kBigitMask;
    borrow = difference >> (kChunkSize - 1);
    ++i;
  }
  Clamp();
}